

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O3

void FM::OPNABase::BuildLFOTable(void)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  long lVar4;
  
  auVar1 = _DAT_001a83d0;
  if (amtable == -1) {
    iVar6 = 0;
    iVar7 = 1;
    iVar8 = 2;
    iVar9 = 3;
    lVar2 = 0;
    auVar3 = _DAT_001a83b0;
    auVar5 = _DAT_001a83c0;
    iVar10 = iVar6;
    iVar11 = iVar7;
    iVar12 = iVar8;
    iVar13 = iVar9;
    do {
      *(int *)(pmtable + lVar2) = iVar6;
      *(int *)(pmtable + lVar2 + 4) = iVar7;
      *(int *)(pmtable + lVar2 + 8) = iVar8;
      *(int *)(pmtable + lVar2 + 0xc) = iVar9;
      auVar14 = auVar5 ^ auVar1;
      auVar15 = auVar3 ^ auVar1;
      uVar16 = -(uint)(auVar14._4_4_ == -0x80000000 && auVar14._0_4_ < -0x7fffff80);
      uVar17 = -(uint)(auVar14._8_4_ < -0x7fffff80 && auVar14._12_4_ == -0x80000000);
      uVar18 = -(uint)(auVar15._0_4_ < -0x7fffff80 && auVar15._4_4_ == -0x80000000);
      uVar19 = -(uint)(auVar15._8_4_ < -0x7fffff80 && auVar15._12_4_ == -0x80000000);
      *(uint *)((long)&amtable + lVar2) =
           ~uVar16 & iVar6 * 2 - 0x100U | iVar10 * -2 + 0xfeU & uVar16 & 0xfffffffc;
      *(uint *)(lVar2 + 0x21bbe4) =
           (~uVar17 & iVar7 * 2 - 0x100U | iVar11 * -2 + 0xfeU & uVar17) & 0xfffffffc;
      *(uint *)(lVar2 + 0x21bbe8) =
           ~uVar18 & iVar8 * 2 - 0x100U | iVar12 * -2 + 0xfeU & uVar18 & 0xfffffffc;
      *(uint *)(lVar2 + 0x21bbec) =
           (~uVar19 & iVar9 * 2 - 0x100U | iVar13 * -2 + 0xfeU & uVar19) & 0xfffffffc;
      lVar4 = auVar5._8_8_;
      auVar5._0_8_ = auVar5._0_8_ + 4;
      auVar5._8_8_ = lVar4 + 4;
      lVar4 = auVar3._8_8_;
      auVar3._0_8_ = auVar3._0_8_ + 4;
      auVar3._8_8_ = lVar4 + 4;
      iVar6 = iVar6 + 4;
      iVar7 = iVar7 + 4;
      iVar8 = iVar8 + 4;
      iVar9 = iVar9 + 4;
      iVar10 = iVar10 + 4;
      iVar11 = iVar11 + 4;
      iVar12 = iVar12 + 4;
      iVar13 = iVar13 + 4;
      lVar2 = lVar2 + 0x10;
    } while (lVar2 != 0x400);
  }
  return;
}

Assistant:

void OPNABase::BuildLFOTable()
{
	if (amtable[0] == -1)
	{
		for (int c=0; c<256; c++)
		{
			int v;
			if (c < 0x40)		v = c * 2 + 0x80;
			else if (c < 0xc0)	v = 0x7f - (c - 0x40) * 2 + 0x80;
			else				v = (c - 0xc0) * 2;
			pmtable[c] = c;

			if (c < 0x80)		v = 0xff - c * 2;
			else				v = (c - 0x80) * 2;
			amtable[c] = v & ~3;
		}
	}
}